

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O3

ion_fpos_t array_list_get(int bucket_idx,array_list_t *array_list)

{
  ion_fpos_t iVar1;
  
  iVar1 = -1;
  if (bucket_idx < array_list->current_size) {
    iVar1 = array_list->data[bucket_idx];
  }
  return iVar1;
}

Assistant:

ion_fpos_t
array_list_get(
	int				bucket_idx,
	array_list_t	*array_list
) {
	/* case bucket_idx is outside of current size of array */
	if (bucket_idx >= array_list->current_size) {
		return linear_hash_end_of_list;
	}
	/* case bucket_idx is inside array */
	else {
		return array_list->data[bucket_idx];
	}
}